

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O3

string * usb_sysfs_friendly_name(string *__return_storage_ptr__,string *sys_usb_path)

{
  string *psVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string serial;
  string product;
  uint device_number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string manufacturer;
  undefined1 local_210 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined4 local_1cc;
  string *local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_130 [264];
  
  local_1cc = 0;
  psVar1 = (string *)(local_210 + 0x10);
  pcVar2 = (sys_usb_path->_M_dataplus)._M_p;
  local_210._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_210,pcVar2,pcVar2 + sys_usb_path->_M_string_length);
  std::__cxx11::string::append((char *)local_210);
  read_line((string *)&local_1f0,(string *)local_210._0_8_);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(local_1b8 + 0x10),(string *)local_1f0._M_local_buf,_S_in);
  std::istream::_M_extract<unsigned_int>((uint *)(local_1b8 + 0x10));
  std::__cxx11::istringstream::~istringstream((istringstream *)(local_1b8 + 0x10));
  std::ios_base::~ios_base(local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_allocated_capacity != &local_1e0) {
    operator_delete((void *)local_1f0._M_allocated_capacity,local_1e0._M_allocated_capacity + 1);
  }
  if ((string *)local_210._0_8_ != psVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  pcVar2 = (sys_usb_path->_M_dataplus)._M_p;
  local_1f0._M_allocated_capacity = (size_type)&local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar2,pcVar2 + sys_usb_path->_M_string_length);
  std::__cxx11::string::append(local_1f0._M_local_buf);
  read_line((string *)(local_1b8 + 0x10),(string *)local_1f0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_allocated_capacity != &local_1e0) {
    operator_delete((void *)local_1f0._M_allocated_capacity,local_1e0._M_allocated_capacity + 1);
  }
  pcVar2 = (sys_usb_path->_M_dataplus)._M_p;
  local_210._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_210,pcVar2,pcVar2 + sys_usb_path->_M_string_length);
  std::__cxx11::string::append(local_210);
  read_line((string *)&local_1f0,(string *)local_210._0_8_);
  if ((string *)local_210._0_8_ != psVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  pcVar2 = (sys_usb_path->_M_dataplus)._M_p;
  local_1c8[0] = (string *)local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar2,pcVar2 + sys_usb_path->_M_string_length);
  std::__cxx11::string::append((char *)local_1c8);
  read_line((string *)local_210,local_1c8[0]);
  if (local_1c8[0] != (string *)local_1b8) {
    operator_delete(local_1c8[0],(ulong)(local_1b8._0_8_ + 1));
  }
  if (((local_1a8._8_8_ == 0) && (local_1f0._8_8_ == 0)) && (local_210._8_8_ == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    format_abi_cxx11_(__return_storage_ptr__,"%s %s %s",local_1a8._M_allocated_capacity,
                      local_1f0._M_allocated_capacity,local_210._0_8_);
  }
  if ((string *)local_210._0_8_ != psVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_allocated_capacity != &local_1e0) {
    operator_delete((void *)local_1f0._M_allocated_capacity,local_1e0._M_allocated_capacity + 1);
  }
  paVar3 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_allocated_capacity != paVar3) {
    operator_delete((void *)local_1a8._M_allocated_capacity,local_198[0]._M_allocated_capacity + 1);
    paVar3 = extraout_RAX;
  }
  return (string *)paVar3;
}

Assistant:

string
usb_sysfs_friendly_name(const string& sys_usb_path)
{
    unsigned int device_number = 0;

    istringstream( read_line(sys_usb_path + "/devnum") ) >> device_number;

    string manufacturer = read_line( sys_usb_path + "/manufacturer" );

    string product = read_line( sys_usb_path + "/product" );

    string serial = read_line( sys_usb_path + "/serial" );

    if( manufacturer.empty() && product.empty() && serial.empty() )
        return "";

    return format("%s %s %s", manufacturer.c_str(), product.c_str(), serial.c_str() );
}